

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# que_remv_modi.cpp
# Opt level: O1

void __thiscall student::findRecord(student *this)

{
  _Map_pointer ppsVar1;
  _Elt_pointer psVar2;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  ostream *poVar6;
  long *plVar7;
  long lVar8;
  size_t i;
  ulong uVar9;
  char *pcVar10;
  char is;
  stu temp;
  int num;
  string word;
  stu dis;
  char local_f9;
  undefined1 local_f8 [32];
  _Alloc_hider local_d8;
  size_t local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  int local_b8;
  int iStack_b4;
  int local_b0;
  int local_a4;
  undefined1 *local_a0;
  size_t local_98;
  undefined1 local_90;
  undefined7 uStack_8f;
  char *local_80;
  long local_78;
  char local_70;
  undefined7 uStack_6f;
  char *local_60;
  long local_58;
  char local_50;
  undefined7 uStack_4f;
  int local_40;
  int iStack_3c;
  int local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"----------------Find Record--------------------",0x2f);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  if ((this->students).c.super__Deque_base<stu,_std::allocator<stu>_>._M_impl.super__Deque_impl_data
      ._M_finish._M_cur ==
      (this->students).c.super__Deque_base<stu,_std::allocator<stu>_>._M_impl.super__Deque_impl_data
      ._M_start._M_cur) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Sorry but there is empty",0x18);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Any key to continue",0x13);
    system("pause");
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Your want to search with(name->N, ID->I, ranking->R): ",0x36);
  std::operator>>((istream *)&std::cin,&local_f9);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  local_80 = &local_70;
  local_78 = 0;
  local_70 = '\0';
  local_60 = &local_50;
  local_58 = 0;
  local_50 = '\0';
  local_a0 = &local_90;
  local_98 = 0;
  local_90 = 0;
  if (local_f9 == 'I') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Your want to search: ",0x15);
    std::operator>>((istream *)&std::cin,(string *)&local_a0);
    bVar4 = true;
    uVar9 = 0;
    while( true ) {
      ppsVar1 = (this->students).c.super__Deque_base<stu,_std::allocator<stu>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node;
      psVar2 = (this->students).c.super__Deque_base<stu,_std::allocator<stu>_>._M_impl.
               super__Deque_impl_data._M_start._M_cur;
      if (((long)(this->students).c.super__Deque_base<stu,_std::allocator<stu>_>._M_impl.
                 super__Deque_impl_data._M_start._M_last - (long)psVar2 >> 4) * -0x3333333333333333
          + ((long)(this->students).c.super__Deque_base<stu,_std::allocator<stu>_>._M_impl.
                   super__Deque_impl_data._M_finish._M_cur -
             (long)(this->students).c.super__Deque_base<stu,_std::allocator<stu>_>._M_impl.
                   super__Deque_impl_data._M_finish._M_first >> 4) * -0x3333333333333333 +
            (((long)ppsVar1 -
              (long)(this->students).c.super__Deque_base<stu,_std::allocator<stu>_>._M_impl.
                    super__Deque_impl_data._M_start._M_node >> 3) + -1 +
            (ulong)(ppsVar1 == (_Map_pointer)0x0)) * 6 <= uVar9) break;
      pcVar3 = (psVar2->name)._M_dataplus._M_p;
      local_f8._0_8_ = local_f8 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_f8,pcVar3,pcVar3 + (psVar2->name)._M_string_length);
      local_d8._M_p = (pointer)&local_c8;
      pcVar3 = (psVar2->ID)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d8,pcVar3,pcVar3 + (psVar2->ID)._M_string_length);
      local_b0 = psVar2->ranking;
      local_b8 = psVar2->class1;
      iStack_b4 = psVar2->class2;
      if (local_d0 == local_98) {
        if (local_d0 != 0) {
          iVar5 = bcmp(local_d8._M_p,local_a0,local_d0);
          if (iVar5 != 0) goto LAB_001054f2;
        }
        std::__cxx11::string::_M_assign((string *)&local_80);
        std::__cxx11::string::_M_assign((string *)&local_60);
        local_38 = local_b0;
        local_40 = local_b8;
        iStack_3c = iStack_b4;
        bVar4 = false;
      }
LAB_001054f2:
      std::deque<stu,_std::allocator<stu>_>::pop_front((deque<stu,_std::allocator<stu>_> *)this);
      std::deque<stu,_std::allocator<stu>_>::push_back
                ((deque<stu,_std::allocator<stu>_> *)this,(value_type *)local_f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_p != &local_c8) {
        operator_delete(local_d8._M_p,local_c8._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
        operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
      }
      uVar9 = uVar9 + 1;
    }
  }
  else if (local_f9 == 'R') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Your want to search: ",0x15);
    std::istream::operator>>((istream *)&std::cin,&local_a4);
    bVar4 = true;
    uVar9 = 0;
    while( true ) {
      ppsVar1 = (this->students).c.super__Deque_base<stu,_std::allocator<stu>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node;
      psVar2 = (this->students).c.super__Deque_base<stu,_std::allocator<stu>_>._M_impl.
               super__Deque_impl_data._M_start._M_cur;
      if (((long)(this->students).c.super__Deque_base<stu,_std::allocator<stu>_>._M_impl.
                 super__Deque_impl_data._M_start._M_last - (long)psVar2 >> 4) * -0x3333333333333333
          + ((long)(this->students).c.super__Deque_base<stu,_std::allocator<stu>_>._M_impl.
                   super__Deque_impl_data._M_finish._M_cur -
             (long)(this->students).c.super__Deque_base<stu,_std::allocator<stu>_>._M_impl.
                   super__Deque_impl_data._M_finish._M_first >> 4) * -0x3333333333333333 +
            (((long)ppsVar1 -
              (long)(this->students).c.super__Deque_base<stu,_std::allocator<stu>_>._M_impl.
                    super__Deque_impl_data._M_start._M_node >> 3) + -1 +
            (ulong)(ppsVar1 == (_Map_pointer)0x0)) * 6 <= uVar9) break;
      pcVar3 = (psVar2->name)._M_dataplus._M_p;
      local_f8._0_8_ = local_f8 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_f8,pcVar3,pcVar3 + (psVar2->name)._M_string_length);
      local_d8._M_p = (pointer)&local_c8;
      pcVar3 = (psVar2->ID)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d8,pcVar3,pcVar3 + (psVar2->ID)._M_string_length);
      local_b0 = psVar2->ranking;
      local_b8 = psVar2->class1;
      iStack_b4 = psVar2->class2;
      if (local_b0 == local_a4) {
        std::__cxx11::string::_M_assign((string *)&local_80);
        std::__cxx11::string::_M_assign((string *)&local_60);
        local_38 = local_b0;
        local_40 = local_b8;
        iStack_3c = iStack_b4;
        bVar4 = false;
      }
      std::deque<stu,_std::allocator<stu>_>::pop_front((deque<stu,_std::allocator<stu>_> *)this);
      std::deque<stu,_std::allocator<stu>_>::push_back
                ((deque<stu,_std::allocator<stu>_> *)this,(value_type *)local_f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_p != &local_c8) {
        operator_delete(local_d8._M_p,local_c8._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
        operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
      }
      uVar9 = uVar9 + 1;
    }
  }
  else {
    if (local_f9 != 'N') {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Error",5);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
      std::ostream::put(-8);
      std::ostream::flush();
      goto LAB_00105798;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Your want to search: ",0x15);
    std::operator>>((istream *)&std::cin,(string *)&local_a0);
    bVar4 = true;
    uVar9 = 0;
    while( true ) {
      ppsVar1 = (this->students).c.super__Deque_base<stu,_std::allocator<stu>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node;
      psVar2 = (this->students).c.super__Deque_base<stu,_std::allocator<stu>_>._M_impl.
               super__Deque_impl_data._M_start._M_cur;
      if (((long)(this->students).c.super__Deque_base<stu,_std::allocator<stu>_>._M_impl.
                 super__Deque_impl_data._M_start._M_last - (long)psVar2 >> 4) * -0x3333333333333333
          + ((long)(this->students).c.super__Deque_base<stu,_std::allocator<stu>_>._M_impl.
                   super__Deque_impl_data._M_finish._M_cur -
             (long)(this->students).c.super__Deque_base<stu,_std::allocator<stu>_>._M_impl.
                   super__Deque_impl_data._M_finish._M_first >> 4) * -0x3333333333333333 +
            (((long)ppsVar1 -
              (long)(this->students).c.super__Deque_base<stu,_std::allocator<stu>_>._M_impl.
                    super__Deque_impl_data._M_start._M_node >> 3) + -1 +
            (ulong)(ppsVar1 == (_Map_pointer)0x0)) * 6 <= uVar9) break;
      pcVar3 = (psVar2->name)._M_dataplus._M_p;
      local_f8._0_8_ = local_f8 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_f8,pcVar3,pcVar3 + (psVar2->name)._M_string_length);
      local_d8._M_p = (pointer)&local_c8;
      pcVar3 = (psVar2->ID)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d8,pcVar3,pcVar3 + (psVar2->ID)._M_string_length);
      local_b0 = psVar2->ranking;
      local_b8 = psVar2->class1;
      iStack_b4 = psVar2->class2;
      if (local_f8._8_8_ == local_98) {
        if (local_f8._8_8_ != 0) {
          iVar5 = bcmp((void *)local_f8._0_8_,local_a0,local_f8._8_8_);
          if (iVar5 != 0) goto LAB_00105185;
        }
        std::__cxx11::string::_M_assign((string *)&local_80);
        std::__cxx11::string::_M_assign((string *)&local_60);
        local_38 = local_b0;
        local_40 = local_b8;
        iStack_3c = iStack_b4;
        bVar4 = false;
      }
LAB_00105185:
      std::deque<stu,_std::allocator<stu>_>::pop_front((deque<stu,_std::allocator<stu>_> *)this);
      std::deque<stu,_std::allocator<stu>_>::push_back
                ((deque<stu,_std::allocator<stu>_> *)this,(value_type *)local_f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_p != &local_c8) {
        operator_delete(local_d8._M_p,local_c8._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
        operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
      }
      uVar9 = uVar9 + 1;
    }
  }
  if (bVar4) {
    lVar8 = 0x2d;
    pcVar10 = "Sorry but the student you search is not exist";
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"------------------Record-------------------",0x2b);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"name: ",6);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_80,local_78);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"    ID: ",8);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_60,local_58);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"class1: ",8);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_40);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"   class2: ",0xb);
    plVar7 = (long *)std::ostream::operator<<(poVar6,iStack_3c);
    std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
    std::ostream::put((char)plVar7);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ranking: ",9);
    std::ostream::operator<<((ostream *)&std::cout,local_38);
    lVar8 = 0x2b;
    pcVar10 = "-------------------End---------------------";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar10,lVar8);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Any key to continue",0x13);
  system("pause");
LAB_00105798:
  if (local_a0 != &local_90) {
    operator_delete(local_a0,CONCAT71(uStack_8f,local_90) + 1);
  }
  if (local_60 != &local_50) {
    operator_delete(local_60,CONCAT71(uStack_4f,local_50) + 1);
  }
  if (local_80 != &local_70) {
    operator_delete(local_80,CONCAT71(uStack_6f,local_70) + 1);
  }
  return;
}

Assistant:

void student::findRecord(){
    //savedTag("findRecord");
    cout<<"----------------Find Record--------------------"<<endl;
    if(student::students.empty()){
        cout<<"Sorry but there is empty"<<endl;
        cout<<"Any key to continue";
        system("pause");
        return;
    }
    char is;
    cout<<"Your want to search with(name->N, ID->I, ranking->R): ";
    cin >> is; cout<<endl;
    stu dis;            
    string word;
    int num; int flag =1;
    switch(is){
        case 'N':
            cout<<"Your want to search: ";
            cin>>word;
            for(size_t i=0;i < student::students.size();i++){
                stu temp = student::students.front();
                if(temp.name==word){
                    dis = temp;
                    flag = 0;
                }
                student::students.pop();
                student::students.push(temp);
            }
            break;
        case 'I':
            cout<<"Your want to search: ";
            cin>>word;
            for(size_t i=0;i < student::students.size();i++){
                stu temp = student::students.front();
                if(temp.ID==word){
                    dis = temp;
                    flag = 0;
                }
                student::students.pop();
                student::students.push(temp);
            }
            break;
        case 'R':
            cout<<"Your want to search: ";
            cin>>num;
            for(size_t i=0;i<student::students.size();i++){
                stu temp = student::students.front();
                if(temp.ranking==num){
                    dis = temp;
                    flag = 0;
                }
                student::students.pop();
                student::students.push(temp);
            }
            break;
        default:
            cout<<"Error"<<endl;
            return;
    }
    if(flag){
        cout<<"Sorry but the student you search is not exist"<<endl;
        cout<<"Any key to continue";
        system("pause");
        return;
    }
    cout<<"------------------Record-------------------"<<endl;
    cout<<"name: "<<dis.name<<"    ID: "<<dis.ID<<endl;
    cout<<"class1: "<<dis.class1<<"   class2: "<<dis.class2<<endl;
    cout<<"ranking: "<<dis.ranking;
    cout<<"-------------------End---------------------"<<endl;
    cout<<"Any key to continue";
    system("pause");
    return;
}